

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

ArrayPtr<const_kj::(anonymous_namespace)::HttpTestCase> kj::anon_unknown_0::pipelineTestCases(void)

{
  initializer_list<kj::StringPtr> init;
  initializer_list<kj::StringPtr> init_00;
  initializer_list<kj::StringPtr> init_01;
  initializer_list<kj::StringPtr> init_02;
  initializer_list<kj::StringPtr> init_03;
  initializer_list<kj::StringPtr> init_04;
  int iVar1;
  size_t size;
  ArrayPtr<const_kj::(anonymous_namespace)::HttpTestCase> AVar2;
  initializer_list<kj::StringPtr> local_830;
  InitializeableArray<kj::StringPtr> local_820;
  unsigned_long local_808;
  Maybe<unsigned_long> local_800;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_7f0;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_7e0;
  ArrayPtr<const_char> local_7c8;
  ArrayPtr<const_char> local_7b8;
  initializer_list<kj::StringPtr> local_7a8;
  InitializeableArray<kj::StringPtr> local_798;
  unsigned_long local_780;
  Maybe<unsigned_long> local_778;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_768;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_758;
  ArrayPtr<const_char> local_740;
  ArrayPtr<const_char> local_730;
  undefined1 local_719;
  StringPtr local_718;
  iterator local_708;
  undefined8 local_700;
  InitializeableArray<kj::StringPtr> local_6f8;
  unsigned_long local_6e0;
  Maybe<unsigned_long> local_6d8;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_6c8;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_6b8;
  ArrayPtr<const_char> local_6a0;
  ArrayPtr<const_char> local_690;
  initializer_list<kj::StringPtr> local_680;
  InitializeableArray<kj::StringPtr> local_670;
  unsigned_long local_658;
  Maybe<unsigned_long> local_650;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_640;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_630;
  ArrayPtr<const_char> local_618;
  ArrayPtr<const_char> local_608;
  undefined1 local_5f1;
  StringPtr local_5f0;
  StringPtr local_5e0;
  iterator local_5d0;
  undefined8 local_5c8;
  InitializeableArray<kj::StringPtr> local_5c0;
  Maybe<unsigned_long> local_5a8;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_598;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_588;
  ArrayPtr<const_char> local_570;
  ArrayPtr<const_char> local_560;
  StringPtr local_550;
  StringPtr local_540;
  iterator local_530;
  undefined8 local_528;
  InitializeableArray<kj::StringPtr> local_520;
  Maybe<unsigned_long> local_508;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_4f8;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_4e8;
  ArrayPtr<const_char> local_4d0;
  ArrayPtr<const_char> local_4c0;
  undefined1 local_4a9;
  initializer_list<kj::StringPtr> local_4a8;
  InitializeableArray<kj::StringPtr> local_498;
  Maybe<unsigned_long> local_480;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_470;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_460;
  ArrayPtr<const_char> local_448;
  ArrayPtr<const_char> local_438;
  initializer_list<kj::StringPtr> local_428;
  InitializeableArray<kj::StringPtr> local_418;
  Maybe<unsigned_long> local_400;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_3f0;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_3e0;
  ArrayPtr<const_char> local_3c8;
  ArrayPtr<const_char> local_3b8;
  undefined1 local_3a1;
  initializer_list<kj::StringPtr> local_3a0;
  InitializeableArray<kj::StringPtr> local_390;
  unsigned_long local_378;
  Maybe<unsigned_long> local_370;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_360;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_350;
  ArrayPtr<const_char> local_338;
  ArrayPtr<const_char> local_328;
  initializer_list<kj::StringPtr> local_318;
  InitializeableArray<kj::StringPtr> local_308;
  unsigned_long local_2f0;
  Maybe<unsigned_long> local_2e8;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_2d8;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_2c8;
  ArrayPtr<const_char> local_2b0;
  ArrayPtr<const_char> local_2a0;
  undefined1 local_289;
  StringPtr local_288;
  iterator local_278;
  undefined8 local_270;
  InitializeableArray<kj::StringPtr> local_268;
  unsigned_long local_250;
  Maybe<unsigned_long> local_248;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_238;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_228;
  ArrayPtr<const_char> local_210;
  ArrayPtr<const_char> local_200;
  StringPtr local_1f0;
  iterator local_1e0;
  undefined8 local_1d8;
  InitializeableArray<kj::StringPtr> local_1d0;
  unsigned_long local_1b8;
  Maybe<unsigned_long> local_1b0;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_1a0;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_190;
  ArrayPtr<const_char> local_178;
  ArrayPtr<const_char> local_168;
  undefined1 local_151;
  StringPtr local_150;
  iterator local_140;
  undefined8 local_138;
  InitializeableArray<kj::StringPtr> local_130;
  unsigned_long local_118;
  Maybe<unsigned_long> local_110;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_100;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_f0;
  ArrayPtr<const_char> local_d8;
  ArrayPtr<const_char> local_c8;
  initializer_list<kj::StringPtr> local_b8;
  InitializeableArray<kj::StringPtr> local_a8;
  unsigned_long local_90;
  Maybe<unsigned_long> local_88;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_78;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_68;
  ArrayPtr<const_char> local_50 [2];
  ArrayPtr<const_char> local_30;
  HttpTestCase *local_20;
  
  if ((anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS);
    if (iVar1 != 0) {
      local_20 = pipelineTestCases::PIPELINE_TESTS;
      StringPtr::StringPtr((StringPtr *)&local_30,"GET / HTTP/1.1\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)local_50,"/");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_78);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_68,local_78);
      local_90 = 0;
      Maybe<unsigned_long>::Maybe(&local_88,&local_90);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_b8);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_a8,local_b8);
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[0].request,(StringPtr)local_30,GET,
                 (StringPtr)local_50[0],&local_68,&local_88,&local_a8,BOTH);
      local_151 = 1;
      StringPtr::StringPtr
                ((StringPtr *)&local_c8,"HTTP/1.1 200 OK\r\nContent-Length: 7\r\n\r\nfoo bar");
      StringPtr::StringPtr((StringPtr *)&local_d8,"OK");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_100)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_f0,local_100);
      local_118 = 7;
      Maybe<unsigned_long>::Maybe(&local_110,&local_118);
      StringPtr::StringPtr(&local_150,"foo bar");
      local_140 = &local_150;
      local_138 = 1;
      init_04._M_len = 1;
      init_04._M_array = local_140;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_130,init_04);
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[0].response,(StringPtr)local_c8,200,
                 (StringPtr)local_d8,&local_f0,&local_110,&local_130,GET,BOTH);
      local_151 = 0;
      local_20 = (HttpTestCase *)0x7e51a0;
      StringPtr::StringPtr
                ((StringPtr *)&local_168,"POST /foo HTTP/1.1\r\nContent-Length: 6\r\n\r\ngrault");
      StringPtr::StringPtr((StringPtr *)&local_178,"/foo");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_1a0)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_190,local_1a0);
      local_1b8 = 6;
      Maybe<unsigned_long>::Maybe(&local_1b0,&local_1b8);
      StringPtr::StringPtr(&local_1f0,"grault");
      local_1e0 = &local_1f0;
      local_1d8 = 1;
      init_03._M_len = 1;
      init_03._M_array = local_1e0;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_1d0,init_03);
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[1].request,(StringPtr)local_168,POST,
                 (StringPtr)local_178,&local_190,&local_1b0,&local_1d0,BOTH);
      local_289 = 1;
      StringPtr::StringPtr
                ((StringPtr *)&local_200,
                 "HTTP/1.1 404 Not Found\r\nContent-Length: 13\r\n\r\nbaz qux corge");
      StringPtr::StringPtr((StringPtr *)&local_210,"Not Found");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_238)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_228,local_238);
      local_250 = 0xd;
      Maybe<unsigned_long>::Maybe(&local_248,&local_250);
      StringPtr::StringPtr(&local_288,"baz qux corge");
      local_278 = &local_288;
      local_270 = 1;
      init_02._M_len = 1;
      init_02._M_array = local_278;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_268,init_02);
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[1].response,(StringPtr)local_200,0x194,
                 (StringPtr)local_210,&local_228,&local_248,&local_268,GET,BOTH);
      local_289 = 0;
      local_20 = (HttpTestCase *)0x7e5280;
      StringPtr::StringPtr
                ((StringPtr *)&local_2a0,"POST /foo HTTP/1.1\r\nContent-Length: 0\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_2b0,"/foo");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_2d8)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_2c8,local_2d8);
      local_2f0 = 0;
      Maybe<unsigned_long>::Maybe(&local_2e8,&local_2f0);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_318);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_308,local_318);
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[2].request,(StringPtr)local_2a0,POST,
                 (StringPtr)local_2b0,&local_2c8,&local_2e8,&local_308,BOTH);
      local_3a1 = 1;
      StringPtr::StringPtr((StringPtr *)&local_328,"HTTP/1.1 200 OK\r\nContent-Length: 0\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_338,"OK");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_360)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_350,local_360);
      local_378 = 0;
      Maybe<unsigned_long>::Maybe(&local_370,&local_378);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_3a0);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_390,local_3a0);
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[2].response,(StringPtr)local_328,200,
                 (StringPtr)local_338,&local_350,&local_370,&local_390,GET,BOTH);
      local_3a1 = 0;
      local_20 = (HttpTestCase *)0x7e5360;
      StringPtr::StringPtr
                ((StringPtr *)&local_3b8,
                 "POST /foo HTTP/1.1\r\nTransfer-Encoding: chunked\r\n\r\n0\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_3c8,"/foo");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_3f0)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_3e0,local_3f0);
      Maybe<unsigned_long>::Maybe(&local_400,(void *)0x0);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_428);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_418,local_428);
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[3].request,(StringPtr)local_3b8,POST,
                 (StringPtr)local_3c8,&local_3e0,&local_400,&local_418,BOTH);
      local_4a9 = 1;
      StringPtr::StringPtr
                ((StringPtr *)&local_438,
                 "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\n\r\n0\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_448,"OK");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_470)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_460,local_470);
      Maybe<unsigned_long>::Maybe(&local_480,(void *)0x0);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_4a8);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_498,local_4a8);
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[3].response,(StringPtr)local_438,200,
                 (StringPtr)local_448,&local_460,&local_480,&local_498,GET,BOTH);
      local_4a9 = 0;
      local_20 = (HttpTestCase *)0x7e5440;
      StringPtr::StringPtr
                ((StringPtr *)&local_4c0,
                 "POST /bar HTTP/1.1\r\nTransfer-Encoding: chunked\r\n\r\n6\r\ngarply\r\n5\r\nwaldo\r\n0\r\n\r\n"
                );
      StringPtr::StringPtr((StringPtr *)&local_4d0,"/bar");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_4f8)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_4e8,local_4f8);
      Maybe<unsigned_long>::Maybe(&local_508,(void *)0x0);
      StringPtr::StringPtr(&local_550,"garply");
      StringPtr::StringPtr(&local_540,"waldo");
      local_530 = &local_550;
      local_528 = 2;
      init_01._M_len = 2;
      init_01._M_array = local_530;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_520,init_01);
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[4].request,(StringPtr)local_4c0,POST,
                 (StringPtr)local_4d0,&local_4e8,&local_508,&local_520,BOTH);
      local_5f1 = 1;
      StringPtr::StringPtr
                ((StringPtr *)&local_560,
                 "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\n\r\n4\r\nfred\r\n5\r\nplugh\r\n0\r\n\r\n"
                );
      StringPtr::StringPtr((StringPtr *)&local_570,"OK");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_598)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_588,local_598);
      Maybe<unsigned_long>::Maybe(&local_5a8,(void *)0x0);
      StringPtr::StringPtr(&local_5f0,"fred");
      StringPtr::StringPtr(&local_5e0,"plugh");
      local_5d0 = &local_5f0;
      local_5c8 = 2;
      init_00._M_len = 2;
      init_00._M_array = local_5d0;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_5c0,init_00);
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[4].response,(StringPtr)local_560,200,
                 (StringPtr)local_570,&local_588,&local_5a8,&local_5c0,GET,BOTH);
      local_5f1 = 0;
      local_20 = (HttpTestCase *)0x7e5520;
      StringPtr::StringPtr((StringPtr *)&local_608,"HEAD / HTTP/1.1\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_618,"/");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_640)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_630,local_640);
      local_658 = 0;
      Maybe<unsigned_long>::Maybe(&local_650,&local_658);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_680);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_670,local_680);
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[5].request,(StringPtr)local_608,HEAD,
                 (StringPtr)local_618,&local_630,&local_650,&local_670,BOTH);
      local_719 = 1;
      StringPtr::StringPtr((StringPtr *)&local_690,"HTTP/1.1 200 OK\r\nContent-Length: 7\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_6a0,"OK");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_6c8)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_6b8,local_6c8);
      local_6e0 = 7;
      Maybe<unsigned_long>::Maybe(&local_6d8,&local_6e0);
      StringPtr::StringPtr(&local_718,"foo bar");
      local_708 = &local_718;
      local_700 = 1;
      init._M_len = 1;
      init._M_array = local_708;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_6f8,init);
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[5].response,(StringPtr)local_690,200,
                 (StringPtr)local_6a0,&local_6b8,&local_6d8,&local_6f8,GET,BOTH);
      local_719 = 0;
      local_20 = (HttpTestCase *)0x7e5600;
      StringPtr::StringPtr((StringPtr *)&local_730,"HEAD / HTTP/1.1\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_740,"/");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_768)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_758,local_768);
      local_780 = 0;
      Maybe<unsigned_long>::Maybe(&local_778,&local_780);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_7a8);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_798,local_7a8);
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[6].request,(StringPtr)local_730,HEAD,
                 (StringPtr)local_740,&local_758,&local_778,&local_798,BOTH);
      StringPtr::StringPtr((StringPtr *)&local_7b8,"HTTP/1.1 200 OK\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_7c8,"OK");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_7f0)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_7e0,local_7f0);
      local_808 = 0;
      Maybe<unsigned_long>::Maybe(&local_800,&local_808);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_830);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_820,local_830);
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[6].response,(StringPtr)local_7b8,200,
                 (StringPtr)local_7c8,&local_7e0,&local_800,&local_820,HEAD,BOTH);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_820);
      Maybe<unsigned_long>::~Maybe(&local_800);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_7e0);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_798);
      Maybe<unsigned_long>::~Maybe(&local_778);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_758);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_6f8);
      Maybe<unsigned_long>::~Maybe(&local_6d8);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_6b8);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_670);
      Maybe<unsigned_long>::~Maybe(&local_650);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_630);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_5c0);
      Maybe<unsigned_long>::~Maybe(&local_5a8);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_588);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_520);
      Maybe<unsigned_long>::~Maybe(&local_508);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_4e8);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_498);
      Maybe<unsigned_long>::~Maybe(&local_480);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_460);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_418);
      Maybe<unsigned_long>::~Maybe(&local_400);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_3e0);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_390);
      Maybe<unsigned_long>::~Maybe(&local_370);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_350);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_308);
      Maybe<unsigned_long>::~Maybe(&local_2e8);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_2c8);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_268);
      Maybe<unsigned_long>::~Maybe(&local_248);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_228);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_1d0);
      Maybe<unsigned_long>::~Maybe(&local_1b0);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_190);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_130);
      Maybe<unsigned_long>::~Maybe(&local_110);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_f0);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_a8);
      Maybe<unsigned_long>::~Maybe(&local_88);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_68);
      __cxa_atexit(__cxx_global_array_dtor_572,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS);
    }
  }
  size = size<kj::(anonymous_namespace)::HttpTestCase_const,7ul>(&pipelineTestCases::PIPELINE_TESTS)
  ;
  AVar2 = arrayPtr<kj::(anonymous_namespace)::HttpTestCase_const>
                    (pipelineTestCases::PIPELINE_TESTS,size);
  return AVar2;
}

Assistant:

kj::ArrayPtr<const HttpTestCase> pipelineTestCases() {
  static const HttpTestCase PIPELINE_TESTS[] = {
    {
      {
        "GET / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::GET, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 7\r\n"
        "\r\n"
        "foo bar",

        200, "OK", {}, 7, { "foo bar" }
      },
    },

    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Content-Length: 6\r\n"
        "\r\n"
        "grault",

        HttpMethod::POST, "/foo", {}, 6, { "grault" },
      },
      {
        "HTTP/1.1 404 Not Found\r\n"
        "Content-Length: 13\r\n"
        "\r\n"
        "baz qux corge",

        404, "Not Found", {}, 13, { "baz qux corge" }
      },
    },

    // Throw a zero-size request/response into the pipeline to check for a bug that existed with
    // them previously.
    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Content-Length: 0\r\n"
        "\r\n",

        HttpMethod::POST, "/foo", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 0\r\n"
        "\r\n",

        200, "OK", {}, uint64_t(0), {}
      },
    },

    // Also a zero-size chunked request/response.
    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "0\r\n"
        "\r\n",

        HttpMethod::POST, "/foo", {}, nullptr, {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "0\r\n"
        "\r\n",

        200, "OK", {}, nullptr, {}
      },
    },

    {
      {
        "POST /bar HTTP/1.1\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "6\r\n"
        "garply\r\n"
        "5\r\n"
        "waldo\r\n"
        "0\r\n"
        "\r\n",

        HttpMethod::POST, "/bar", {}, nullptr, { "garply", "waldo" },
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "4\r\n"
        "fred\r\n"
        "5\r\n"
        "plugh\r\n"
        "0\r\n"
        "\r\n",

        200, "OK", {}, nullptr, { "fred", "plugh" }
      },
    },

    {
      {
        "HEAD / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::HEAD, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 7\r\n"
        "\r\n",

        200, "OK", {}, 7, { "foo bar" }
      },
    },

    // Zero-length expected size response to HEAD request has no Content-Length header.
    {
      {
        "HEAD / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::HEAD, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "\r\n",

        200, "OK", {}, uint64_t(0), {}, HttpMethod::HEAD,
      },
    },
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents RESPONSE_TEST_CASES from implicitly
  //   casting to our return type.
  return kj::arrayPtr(PIPELINE_TESTS, kj::size(PIPELINE_TESTS));
}